

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O2

void __thiscall PeleLM::post_init(PeleLM *this,Real stop_time)

{
  BoxArray *bxs;
  DistributionMapping *dm;
  double dVar1;
  double dVar2;
  uint uVar3;
  pointer puVar4;
  __uniq_ptr_data<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>,_true,_true> _Var5;
  MultiFab *pMVar6;
  double dVar7;
  Real RVar8;
  Real RVar9;
  int iVar10;
  int iVar11;
  ostream *poVar12;
  Print *pPVar13;
  ulong uVar14;
  int lev;
  long lVar15;
  long lVar16;
  int k;
  size_type sVar17;
  bool bVar18;
  bool bVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  Real dt_init;
  ulong local_428;
  Real local_420;
  undefined1 local_418 [16];
  Real local_408;
  PeleLM *local_400;
  int local_3f4;
  size_type local_3f0;
  Real dt_init2;
  Vector<double,_std::allocator<double>_> dt_save;
  Vector<int,_std::allocator<int>_> nc_save;
  Vector<double,_std::allocator<double>_> dt_save2;
  Vector<int,_std::allocator<int>_> nc_save2;
  MFInfo local_360;
  Vector<double,_std::allocator<double>_> dt_level;
  MultiFab Forcing_tmp;
  
  if ((this->super_NavierStokesBase).super_AmrLevel.level < 1) {
    local_408 = stop_time;
    dVar7 = amrex::ParallelDescriptor::second();
    local_420 = amrex::StateData::curTime
                          ((this->super_NavierStokesBase).super_AmrLevel.state.
                           super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>.
                           _M_impl.super__Vector_impl_data._M_start);
    uVar3 = *(uint *)&(((this->super_NavierStokesBase).super_AmrLevel.parent)->super_AmrCore).
                      super_AmrMesh.super_AmrInfo.field_0x8c;
    local_428 = (ulong)uVar3;
    lVar16 = (long)(int)uVar3;
    dt_init = 0.0;
    dt_init2 = 0.0;
    sVar17 = lVar16 + 1;
    std::vector<double,_std::allocator<double>_>::vector
              (&dt_save.super_vector<double,_std::allocator<double>_>,sVar17,
               (allocator_type *)&dt_level);
    std::vector<int,_std::allocator<int>_>::vector
              (&nc_save.super_vector<int,_std::allocator<int>_>,sVar17,(allocator_type *)&dt_level);
    std::vector<double,_std::allocator<double>_>::vector
              (&dt_save2.super_vector<double,_std::allocator<double>_>,sVar17,
               (allocator_type *)&dt_level);
    local_3f0 = sVar17;
    std::vector<int,_std::allocator<int>_>::vector
              (&nc_save2.super_vector<int,_std::allocator<int>_>,sVar17,(allocator_type *)&dt_level)
    ;
    local_418 = ZEXT816(0);
    if (lev0cellCount < 0.0) {
      lev0cellCount = getCellsCount(this);
    }
    uVar14 = local_428;
    if (closed_chamber == 1) {
      for (; 0 < (int)uVar14; uVar14 = uVar14 - 1) {
        puVar4 = (((this->super_NavierStokesBase).super_AmrLevel.parent)->amr_level).
                 super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                 .
                 super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        _Var5.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
        super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
        super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
             puVar4[uVar14 - 1]._M_t.
             super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
        NavierStokesBase::average_down
                  ((NavierStokesBase *)
                   _Var5.
                   super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
                   super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,
                   *(MultiFab **)
                    (*(long *)((long)puVar4[uVar14]._M_t.
                                     super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                              + 0x170) + 200 + (long)NavierStokesBase::Divu_Type * 0xe0),
                   *(MultiFab **)
                    (*(long *)&(((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
                                ((long)_Var5.
                                       super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                       .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl
                                + 0x170))->
                               super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>).
                               super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>
                     + (long)NavierStokesBase::Divu_Type * 0xe0 + 200),0,1);
      }
      local_418 = ZEXT816(0);
      for (lVar15 = 0; lVar15 <= lVar16; lVar15 = lVar15 + 1) {
        pMVar6 = *(MultiFab **)
                  (*(long *)((long)(((this->super_NavierStokesBase).super_AmrLevel.parent)->
                                   amr_level).
                                   super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                   .
                                   super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[lVar15]._M_t.
                                   super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                            + 0x170) + 200 + (long)NavierStokesBase::Divu_Type * 0xe0);
        if (lVar15 == 0) {
          RVar8 = getMFsum(this,pMVar6,0);
          local_418._8_4_ = extraout_XMM0_Dc;
          local_418._0_8_ = RVar8 / lev0cellCount;
          local_418._12_4_ = extraout_XMM0_Dd;
        }
        amrex::MultiFab::plus(pMVar6,-(double)local_418._0_8_,0,1,0);
      }
    }
    NavierStokesBase::post_init_state(&this->super_NavierStokesBase);
    uVar20 = SUB84(local_408,0);
    uVar21 = (undefined4)((ulong)local_408 >> 0x20);
    if (closed_chamber == 1) {
      for (lVar15 = 0; lVar15 <= lVar16; lVar15 = lVar15 + 1) {
        amrex::MultiFab::plus
                  (*(MultiFab **)
                    (*(long *)((long)(((this->super_NavierStokesBase).super_AmrLevel.parent)->
                                     amr_level).
                                     super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                     .
                                     super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start[lVar15]._M_t.
                                     super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                              + 0x170) + 200 + (long)NavierStokesBase::Divu_Type * 0xe0),
                   (Real)local_418._0_8_,0,1,0);
        uVar20 = SUB84(local_408,0);
        uVar21 = (undefined4)((ulong)local_408 >> 0x20);
      }
    }
    NavierStokesBase::post_init_estDT
              (&this->super_NavierStokesBase,&dt_init,&nc_save,&dt_save,
               (Real)CONCAT44(uVar21,uVar20));
    iVar10 = num_divu_iters;
    bVar18 = NavierStokesBase::do_init_proj != 0;
    bVar19 = NavierStokesBase::projector != (Projection *)0x0;
    if (NavierStokesBase::verbose != 0) {
      poVar12 = amrex::OutStream();
      amrex::Print::Print((Print *)&dt_level,poVar12);
      std::operator<<((ostream *)
                      &dt_level.super_vector<double,_std::allocator<double>_>.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage," Doing ");
      pPVar13 = amrex::Print::operator<<((Print *)&dt_level,&num_divu_iters);
      std::operator<<((ostream *)&pPVar13->ss," initial divu iters \n");
      amrex::Print::~Print((Print *)&dt_level);
    }
    if (bVar18 && bVar19) {
      iVar11 = 0;
      sVar17 = local_3f0;
      local_400 = this;
      local_3f4 = iVar10;
      if (iVar10 < 1) {
        local_3f4 = 0;
      }
      for (; iVar11 != local_3f4; iVar11 = iVar11 + 1) {
        for (lVar15 = 0; this = local_400, lVar15 <= lVar16; lVar15 = lVar15 + 1) {
          puVar4 = (((local_400->super_NavierStokesBase).super_AmrLevel.parent)->amr_level).
                   super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                   .
                   super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pMVar6 = *(MultiFab **)
                    (*(long *)((long)puVar4[lVar15]._M_t.
                                     super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                              + 0x170) + 200);
          bxs = &(pMVar6->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray;
          dm = &(pMVar6->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap;
          Forcing_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase =
               (_func_int **)0x1;
          Forcing_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._12_8_
               = 0;
          Forcing_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._20_8_
               = 0;
          Forcing_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat._0_8_ = 0;
          Forcing_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._4_8_
               = 0;
          amrex::MultiFab::MultiFab
                    ((MultiFab *)&dt_level,bxs,dm,
                     (pMVar6->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp,0,
                     (MFInfo *)&Forcing_tmp.super_FabArray<amrex::FArrayBox>,
                     *(FabFactory<amrex::FArrayBox> **)
                      ((long)puVar4[lVar15]._M_t.
                             super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                      + 0x218));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&Forcing_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.
                        m_bat.m_op.m_bndryReg.m_typ);
          local_360.alloc = true;
          local_360._1_7_ = 0;
          local_360.tags.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_360.tags.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_360.arena = (Arena *)0x0;
          local_360.tags.
          super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          amrex::MultiFab::MultiFab
                    ((MultiFab *)&Forcing_tmp.super_FabArray<amrex::FArrayBox>,bxs,dm,10,0,
                     &local_360,
                     *(FabFactory<amrex::FArrayBox> **)
                      ((long)(((this->super_NavierStokesBase).super_AmrLevel.parent)->amr_level).
                             super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                             .
                             super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar15]._M_t.
                             super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                      + 0x218));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_360.tags.
                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   );
          amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                    (&Forcing_tmp.super_FabArray<amrex::FArrayBox>,0.0);
          advance_chemistry((PeleLM *)
                            (((local_400->super_NavierStokesBase).super_AmrLevel.parent)->amr_level)
                            .
                            super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                            .
                            super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar15]._M_t.
                            super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                            ,pMVar6,(MultiFab *)&dt_level,
                            dt_save.super_vector<double,_std::allocator<double>_>.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar15] * 0.5,
                            (MultiFab *)&Forcing_tmp.super_FabArray<amrex::FArrayBox>);
          amrex::MultiFab::~MultiFab((MultiFab *)&Forcing_tmp.super_FabArray<amrex::FArrayBox>);
          amrex::MultiFab::~MultiFab((MultiFab *)&dt_level);
          sVar17 = local_3f0;
        }
        for (lVar15 = 0; lVar15 <= lVar16; lVar15 = lVar15 + 1) {
          (**(code **)(*(long *)(((this->super_NavierStokesBase).super_AmrLevel.parent)->amr_level).
                                super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                .
                                super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar15]._M_t.
                                super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                      + 0x168))
                    (SUB84(local_420,0),
                     dt_save.super_vector<double,_std::allocator<double>_>.
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar15]);
        }
        uVar14 = local_428;
        if (hack_noavgdivu == 0) {
          for (; 0 < (int)uVar14; uVar14 = uVar14 - 1) {
            puVar4 = (((this->super_NavierStokesBase).super_AmrLevel.parent)->amr_level).
                     super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                     .
                     super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            _Var5.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t
            .super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
            super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
                 puVar4[uVar14 - 1]._M_t.
                 super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
            NavierStokesBase::average_down
                      ((NavierStokesBase *)
                       _Var5.
                       super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                       .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,
                       *(MultiFab **)
                        (*(long *)((long)puVar4[uVar14]._M_t.
                                         super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                  + 0x170) + 200 + (long)NavierStokesBase::Divu_Type * 0xe0),
                       *(MultiFab **)
                        (*(long *)&(((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
                                    ((long)_Var5.
                                           super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                           .super__Head_base<0UL,_amrex::AmrLevel_*,_false>.
                                           _M_head_impl + 0x170))->
                                   super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>
                                   ).
                                   super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>
                         + (long)NavierStokesBase::Divu_Type * 0xe0 + 200),0,1);
          }
        }
        RVar8 = amrex::StateData::curTime
                          ((this->super_NavierStokesBase).super_AmrLevel.state.
                           super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                           super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>.
                           _M_impl.super__Vector_impl_data._M_start + NavierStokesBase::Divu_Type);
        if (closed_chamber == 1) {
          for (lVar15 = 0; lVar15 <= lVar16; lVar15 = lVar15 + 1) {
            pMVar6 = *(MultiFab **)
                      (*(long *)((long)(((this->super_NavierStokesBase).super_AmrLevel.parent)->
                                       amr_level).
                                       super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                       .
                                       super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[lVar15]._M_t.
                                       super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                + 0x170) + 200 + (long)NavierStokesBase::Divu_Type * 0xe0);
            if (lVar15 == 0) {
              RVar9 = getMFsum(this,pMVar6,0);
              local_418._8_4_ = extraout_XMM0_Dc_00;
              local_418._0_8_ = RVar9 / lev0cellCount;
              local_418._12_4_ = extraout_XMM0_Dd_00;
            }
            amrex::MultiFab::plus(pMVar6,-(double)local_418._0_8_,0,1,0);
          }
        }
        Projection::initialVelocityProject(NavierStokesBase::projector,0,RVar8,1,1);
        uVar14 = local_428;
        if (closed_chamber == 1) {
          for (lVar15 = 0; uVar14 = local_428, lVar15 <= lVar16; lVar15 = lVar15 + 1) {
            amrex::MultiFab::plus
                      (*(MultiFab **)
                        (*(long *)((long)(((this->super_NavierStokesBase).super_AmrLevel.parent)->
                                         amr_level).
                                         super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                         .
                                         super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start[lVar15]._M_t.
                                         super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                  + 0x170) + 200 + (long)NavierStokesBase::Divu_Type * 0xe0),
                       (Real)local_418._0_8_,0,1,0);
          }
        }
        for (; 0 < (int)uVar14; uVar14 = uVar14 - 1) {
          puVar4 = (((this->super_NavierStokesBase).super_AmrLevel.parent)->amr_level).
                   super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                   .
                   super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          _Var5.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
          super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
          super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
               puVar4[uVar14 - 1]._M_t.
               super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
          NavierStokesBase::average_down
                    ((NavierStokesBase *)
                     _Var5.
                     super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                     .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl,
                     *(MultiFab **)
                      (*(long *)((long)puVar4[uVar14]._M_t.
                                       super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                + 0x170) + 200),
                     *(MultiFab **)
                      (*(long *)&(((Vector<amrex::StateData,_std::allocator<amrex::StateData>_> *)
                                  ((long)_Var5.
                                         super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                         .super__Head_base<0UL,_amrex::AmrLevel_*,_false>.
                                         _M_head_impl + 0x170))->
                                 super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>).
                                 super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>
                      + 200),0,3);
        }
        amrex::Amr::setNCycle((this->super_NavierStokesBase).super_AmrLevel.parent,&nc_save);
        NavierStokesBase::post_init_estDT
                  (&this->super_NavierStokesBase,&dt_init2,&nc_save2,&dt_save2,local_408);
        uVar20 = SUB84(dt_init2,0);
        uVar21 = (undefined4)((ulong)dt_init2 >> 0x20);
        if (dt_init <= dt_init2) {
          uVar20 = SUB84(dt_init,0);
          uVar21 = (undefined4)((ulong)dt_init >> 0x20);
        }
        dt_init = (Real)CONCAT44(uVar21,uVar20);
        std::vector<double,_std::allocator<double>_>::vector
                  (&dt_level.super_vector<double,_std::allocator<double>_>,sVar17,&dt_init,
                   (allocator_type *)&Forcing_tmp);
        amrex::Amr::setDtLevel
                  ((this->super_NavierStokesBase).super_AmrLevel.parent,
                   (Vector<double,_std::allocator<double>_> *)
                   &dt_level.super_vector<double,_std::allocator<double>_>);
        for (lVar15 = 0; lVar15 <= lVar16; lVar15 = lVar15 + 1) {
          dVar1 = dt_save2.super_vector<double,_std::allocator<double>_>.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar15];
          uVar20 = SUB84(dVar1,0);
          uVar21 = (undefined4)((ulong)dVar1 >> 0x20);
          dVar2 = dt_save.super_vector<double,_std::allocator<double>_>.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar15];
          if (dVar2 <= dVar1) {
            uVar20 = SUB84(dVar2,0);
            uVar21 = (undefined4)((ulong)dVar2 >> 0x20);
          }
          dt_save.super_vector<double,_std::allocator<double>_>.
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar15] = (double)CONCAT44(uVar21,uVar20);
          (**(code **)(*(long *)(((this->super_NavierStokesBase).super_AmrLevel.parent)->amr_level).
                                super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                .
                                super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar15]._M_t.
                                super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                      + 0xc0))(SUB84(local_420,0),dt_init,dt_init);
        }
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                  ((_Vector_base<double,_std::allocator<double>_> *)&dt_level);
      }
    }
    post_init_press(this,&dt_init,&nc_save,&dt_save);
    if (0 < NavierStokesBase::sum_interval) {
      (*(this->super_NavierStokesBase).super_AmrLevel._vptr_AmrLevel[0x38])(this);
    }
    if (2 < NavierStokesBase::verbose) {
      local_420 = amrex::ParallelDescriptor::second();
      poVar12 = amrex::OutStream();
      amrex::Print::Print((Print *)&dt_level,poVar12);
      std::operator<<((ostream *)
                      &dt_level.super_vector<double,_std::allocator<double>_>.
                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,"      PeleLM::post_init(): lev: ")
      ;
      pPVar13 = amrex::Print::operator<<
                          ((Print *)&dt_level,&(this->super_NavierStokesBase).super_AmrLevel.level);
      std::operator<<((ostream *)&pPVar13->ss,", time: ");
      std::ostream::_M_insert<double>(local_420 - dVar7);
      std::operator<<((ostream *)&pPVar13->ss,'\n');
      amrex::Print::~Print((Print *)&dt_level);
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&nc_save2);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&dt_save2);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              ((_Vector_base<int,_std::allocator<int>_> *)&nc_save);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              ((_Vector_base<double,_std::allocator<double>_> *)&dt_save);
  }
  return;
}

Assistant:

void
PeleLM::post_init (Real stop_time)
{
  BL_PROFILE("PLM::post_init()");
  if (level > 0)
    //
    // Nothing to sync up at level > 0.
    //
    return;

  const Real strt_time    = ParallelDescriptor::second();
  const Real tnp1         = state[State_Type].curTime();
  const int  finest_level = parent->finestLevel();
  Real dt_init  = 0.0;
  Real dt_init2 = 0.0;
  Real Sbar     = 0.0;

  Vector<Real> dt_save(finest_level+1);
  Vector<int>  nc_save(finest_level+1);
  Vector<Real> dt_save2(finest_level+1);
  Vector<int>  nc_save2(finest_level+1);

  // Get level 0 cells count / uncovered cells count with EB
  if ( lev0cellCount < 0.0 ) {
     lev0cellCount = getCellsCount();
  }

  // ensure system is solvable by creating deltaS = S - Sbar
  if (closed_chamber == 1)
  {
    // ensure divu is average down so computing deltaS = S - Sbar works for multilevel
    for (int lev = finest_level-1; lev >= 0; lev--)
    {
      PeleLM&   fine_lev = getLevel(lev+1);
      PeleLM&   crse_lev = getLevel(lev);

      MultiFab& Divu_crse = crse_lev.get_new_data(Divu_Type);
      MultiFab& Divu_fine = fine_lev.get_new_data(Divu_Type);

      crse_lev.average_down(Divu_fine, Divu_crse, 0, 1);
    }

    // compute Sbar and subtract from S
    for (int lev = 0; lev <= finest_level; lev++)
    {
      // pointer to S
      MultiFab& divu_lev = getLevel(lev).get_new_data(Divu_Type);
      if (lev == 0) {
        // Get S sum
        Real Ssum = getMFsum(divu_lev,0);

        // Normalize by cell count / uncovered cell count if EB
        Sbar = Ssum/lev0cellCount;
      }
      divu_lev.plus(-Sbar,0,1);
    }
  }

  //
  // Ensure state is consistent, i.e. velocity field satisfies initial
  // estimate of constraint, coarse levels are fine level averages, pressure
  // is zero.
  //
  post_init_state();

  if (closed_chamber == 1)
  {
    // restore S
    for (int lev = 0; lev <= finest_level; lev++)
    {
      MultiFab& divu_lev = getLevel(lev).get_new_data(Divu_Type);
      divu_lev.plus(Sbar,0,1);
    }
  }

  //
  // Estimate the initial timestepping.
  //
  post_init_estDT(dt_init,nc_save,dt_save,stop_time);
  //
  // Better estimate needs dt to estimate divu
  //
  const bool do_iter        = do_init_proj && projector;
  const int  init_divu_iter = do_iter ? num_divu_iters : 0;

  if (verbose) {
    amrex::Print() << " Doing " << num_divu_iters << " initial divu iters \n";
  }
  for (int iter = 0; iter < init_divu_iter; ++iter)
  {
    //
    // Update species destruction rates in each level but not state.
    //
    if (NUM_SPECIES > 0)
    {

      for (int k = 0; k <= finest_level; k++)
      {

        MultiFab& S_new = getLevel(k).get_new_data(State_Type);

        //
        // Don't update S_new in this strang_chem() call ...
        //
        MultiFab S_tmp(S_new.boxArray(),S_new.DistributionMap(),S_new.nComp(),0,MFInfo(),getLevel(k).Factory());
        MultiFab Forcing_tmp(S_new.boxArray(),S_new.DistributionMap(),NUM_SPECIES+1,0,MFInfo(),getLevel(k).Factory());
        Forcing_tmp.setVal(0);

        getLevel(k).advance_chemistry(S_new,S_tmp,dt_save[k]/2.0,Forcing_tmp);
      }
    }
    //
    // Recompute the velocity to obey constraint with chemistry and
    // divqrad and then average that down.
    //
    if (NUM_SPECIES > 0)
    {
      for (int k = 0; k <= finest_level; k++)
      {
        MultiFab&  Divu_new = getLevel(k).get_new_data(Divu_Type);
        getLevel(k).calc_divu(tnp1,dt_save[k],Divu_new);
      }

      if (!hack_noavgdivu)
      {
        for (int lev = finest_level-1; lev >= 0; lev--)
        {
          PeleLM&   fine_lev = getLevel(lev+1);
          PeleLM&   crse_lev = getLevel(lev);
          MultiFab& Divu_crse = crse_lev.get_new_data(Divu_Type);
          MultiFab& Divu_fine = fine_lev.get_new_data(Divu_Type);
          crse_lev.average_down(Divu_fine, Divu_crse, 0, 1);
        }
      }
      //
      // Recompute the initial velocity field based on this new constraint
      //
      const Real divu_time = state[Divu_Type].curTime();

      int havedivu = 1;

      // ensure system is solvable by creating deltaS = S - Sbar
      if (closed_chamber == 1)
      {
        // compute Sbar and subtract from S
        for (int lev = 0; lev <= finest_level; lev++)
        {
          // pointer to S
          MultiFab& divu_lev = getLevel(lev).get_new_data(Divu_Type);
          if (lev == 0) {
             // Get S sum
             Real Ssum = getMFsum(divu_lev,0);

             // Normalize by cell count / uncovered cell count if EB
             Sbar = Ssum/lev0cellCount;
          }
          divu_lev.plus(-Sbar,0,1);
        }
      }

      projector->initialVelocityProject(0,divu_time,havedivu,1);

      if (closed_chamber == 1)
      {
        // restore S
        for (int lev = 0; lev <= finest_level; lev++)
        {
          MultiFab& divu_lev = getLevel(lev).get_new_data(Divu_Type);
          divu_lev.plus(Sbar,0,1);
        }
      }

      //
      // Average down the new velocity
      //
      for (int k = finest_level-1; k >= 0; k--)
      {
        PeleLM&   fine_lev = getLevel(k+1);
        PeleLM&   crse_lev = getLevel(k);
        MultiFab&       S_fine  = fine_lev.get_new_data(State_Type);
        MultiFab&       S_crse  = crse_lev.get_new_data(State_Type);

        crse_lev.average_down(S_fine, S_crse, Xvel, AMREX_SPACEDIM);
      }
    }
    //
    // Estimate the initial timestepping again, using new velocity
    // (necessary?) Need to pass space to save dt, nc, but these are
    // hacked, just pass something.
    //
    // reset Ncycle to nref...
    //
    parent->setNCycle(nc_save);
    post_init_estDT(dt_init2, nc_save2, dt_save2, stop_time);
    //
    // Compute dt_init,dt_save as the minimum of the values computed
    // in the calls to post_init_estDT
    // Then setTimeLevel and dt_level to these values.
    //
    dt_init = std::min(dt_init,dt_init2);
    Vector<Real> dt_level(finest_level+1,dt_init);

    parent->setDtLevel(dt_level);
    for (int k = 0; k <= finest_level; k++)
    {
      dt_save[k] = std::min(dt_save[k],dt_save2[k]);
      getLevel(k).setTimeLevel(tnp1,dt_init,dt_init);
    }
  } // end divu_iters

  //
  // Initialize the pressure by iterating the initial timestep.
  //
  post_init_press(dt_init, nc_save, dt_save);
  //
  // Compute the initial estimate of conservation.
  //
  if (sum_interval > 0)
    sum_integrated_quantities();

  if (verbose > 2)
  {
    const int IOProc   = ParallelDescriptor::IOProcessorNumber();
    Real      run_time = ParallelDescriptor::second() - strt_time;

    ParallelDescriptor::ReduceRealMax(run_time,IOProc);

    amrex::Print() << "      PeleLM::post_init(): lev: " << level << ", time: " << run_time << '\n';
  }
}